

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

void __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::FlushBackgroundPages
          (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
           *this)

{
  uint pageCount;
  undefined4 *puVar1;
  PageSegmentBase<Memory::VirtualAllocWrapper> *segment;
  HANDLE pVVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  uint pageCount_00;
  DWORD DVar6;
  FreePageEntry *address;
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *fromSegmentList;
  HANDLE pVVar7;
  ThreadContextId pvVar8;
  undefined8 *in_FS_OFFSET;
  undefined4 *local_38;
  
  iVar5 = (*this->_vptr_PageAllocatorBase[3])();
  if ((char)iVar5 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x732,"(!this->HasMultiThreadAccess())","!this->HasMultiThreadAccess()");
    if (!bVar4) goto LAB_00273721;
    *puVar1 = 0;
  }
  if (this->backgroundPageQueue == (BackgroundPageQueue *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    local_38 = (undefined4 *)*in_FS_OFFSET;
    *local_38 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x733,"(backgroundPageQueue)","backgroundPageQueue");
    if (!bVar4) {
LAB_00273721:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *local_38 = 0;
  }
  else {
    local_38 = (undefined4 *)*in_FS_OFFSET;
  }
  pageCount_00 = 0;
  do {
    address = BackgroundPageQueue::PopFreePageEntry(this->backgroundPageQueue);
    if (address == (FreePageEntry *)0x0) {
      LogFreePages(this,(ulong)pageCount_00);
      bVar4 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
      if ((bVar4) && (this->pageAllocatorFlagTable->Verbose == true)) {
        pvVar8 = JsUtil::ExternalApi::GetCurrentThreadContextId();
        DVar6 = GetCurrentThreadId();
        Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar8,(ulong)DVar6,this);
        if (this->debugName != (char16 *)0x0) {
          Output::Print(L"[%s] ");
        }
        Output::Print(L"New free pages: %d\n",(ulong)pageCount_00);
        Output::Print(L"\n");
        Output::Flush();
      }
      AddFreePageCount(this,pageCount_00);
      return;
    }
    segment = address->segment;
    pageCount = address->pageCount;
    fromSegmentList = GetSegmentList(this,segment);
    if (fromSegmentList ==
        (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_38 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x745,"(fromSegmentList != nullptr)","fromSegmentList != nullptr");
      if (!bVar4) goto LAB_00273721;
      *local_38 = 0;
    }
    pVVar2 = this->processHandle;
    pVVar7 = GetCurrentProcess();
    if (pVVar2 != pVVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_38 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x747,"(this->processHandle == GetCurrentProcess())",
                         "this->processHandle == GetCurrentProcess()");
      if (!bVar4) goto LAB_00273721;
      *local_38 = 0;
    }
    address->Next = (FreePageEntry *)0x0;
    address->segment = (PageSegmentBase<Memory::VirtualAllocWrapper> *)0x0;
    *(undefined8 *)&address->pageCount = 0;
    PageSegmentBase<Memory::VirtualAllocWrapper>::ReleasePages(segment,address,pageCount);
    pageCount_00 = pageCount_00 + pageCount;
    TransferSegment(this,segment,fromSegmentList);
  } while( true );
}

Assistant:

void
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::FlushBackgroundPages()
{
    Assert(!this->HasMultiThreadAccess());
    Assert(backgroundPageQueue);

    // We can have additional pages queued up to be zeroed out here
    // and that's okay since they'll eventually be zeroed out before being flushed

    uint newFreePages = 0;

    while (true)
    {
        FreePageEntry * freePageEntry = backgroundPageQueue->PopFreePageEntry();
        if (freePageEntry == nullptr)
        {
            break;
        }
        TPageSegment * segment = freePageEntry->segment;
        uint pageCount = freePageEntry->pageCount;

        DListBase<TPageSegment> * fromSegmentList = GetSegmentList(segment);
        Assert(fromSegmentList != nullptr);

        Assert(this->processHandle == GetCurrentProcess());
        memset(freePageEntry, 0, sizeof(FreePageEntry));

        segment->ReleasePages(freePageEntry, pageCount);
        newFreePages += pageCount;

        TransferSegment(segment, fromSegmentList);
    }

    LogFreePages(newFreePages);

    PAGE_ALLOC_VERBOSE_TRACE(_u("New free pages: %d\n"), newFreePages);
    this->AddFreePageCount(newFreePages);
}